

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::DoRedeferFunction(FunctionBody *this,uint inactiveThreshold)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  FunctionInfo *this_00;
  FunctionBody *pFVar4;
  ByteBlock *pBVar5;
  bool local_29;
  uint local_28;
  bool isJitModeFunction;
  bool isJitCandidate;
  uint currentThreshold;
  uint uStack_1c;
  bool overflow;
  uint compileCount;
  uint inactiveThreshold_local;
  FunctionBody *this_local;
  
  uStack_1c = inactiveThreshold;
  _compileCount = this;
  this_00 = FunctionProxy::GetFunctionInfo((FunctionProxy *)this);
  pFVar4 = (FunctionBody *)FunctionInfo::GetFunctionProxy(this_00);
  if ((((pFVar4 != this) || (bVar1 = FunctionProxy::CanBeDeferred((FunctionProxy *)this), !bVar1))
      || (pBVar5 = GetByteCode(this), pBVar5 == (ByteBlock *)0x0)) ||
     (bVar1 = GetCanDefer(this), !bVar1)) {
    return false;
  }
  uVar2 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea41a0,RedeferralPhase,uVar2,LVar3);
  if (!bVar1) {
    uVar2 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea7040,RedeferralPhase,uVar2,LVar3);
    if (!bVar1) {
      currentThreshold = FunctionProxy::GetCompileCount((FunctionProxy *)this);
      if (DAT_01eace40 <= currentThreshold) {
        return false;
      }
      isJitCandidate = false;
      local_28 = uStack_1c;
      if (1 < currentThreshold) {
        local_28 = JavascriptNumber::DirectPowIntInt(&isJitCandidate,uStack_1c,currentThreshold);
      }
      if ((isJitCandidate & 1U) != 0) {
        local_28 = 0xffffffff;
      }
      uVar2 = GetInactiveCount(this);
      if (uVar2 < local_28) {
        return false;
      }
    }
  }
  bVar1 = IsInterpreterExecutionMode(this);
  local_29 = MapEntryPointsUntil<Js::FunctionBody::DoRedeferFunction(unsigned_int)const::__0>
                       (this,(anon_class_1_1_c2969d66)((bVar1 ^ 0xffU) & 1));
  if (!local_29) {
    local_29 = MapLoopHeadersUntil<Js::FunctionBody::DoRedeferFunction(unsigned_int)const::__1>
                         (this);
  }
  return (bool)((local_29 ^ 0xffU) & 1);
}

Assistant:

bool FunctionBody::DoRedeferFunction(uint inactiveThreshold) const
    {
        if (!(this->GetFunctionInfo()->GetFunctionProxy() == this &&
              this->CanBeDeferred() &&
              this->GetByteCode() &&
              this->GetCanDefer()))
        {
            return false;
        }

        if (!PHASE_FORCE(Js::RedeferralPhase, this) && !PHASE_STRESS(Js::RedeferralPhase, this))
        {
            uint compileCount = this->GetCompileCount();
            if (compileCount >= (uint)CONFIG_FLAG(RedeferralCap))
            {
                return false;
            }
            // Redeferral threshold is k^x, where x is the number of previous compiles.
            bool overflow = false;
            uint currentThreshold = inactiveThreshold;
            if (compileCount > 1)
            {
                currentThreshold = JavascriptNumber::DirectPowIntInt(&overflow, inactiveThreshold, compileCount);
            }
            if (overflow)
            {
                currentThreshold = 0xFFFFFFFF;
            }
            if (this->GetInactiveCount() < currentThreshold)
            {
                return false;
            }
        }

        // Make sure the function won't be jitted
        bool isJitCandidate = false;
#if ENABLE_NATIVE_CODEGEN
        bool isJitModeFunction = !this->IsInterpreterExecutionMode();
        isJitCandidate = MapEntryPointsUntil([=](int index, FunctionEntryPointInfo *entryPointInfo)
        {
            if ((entryPointInfo->IsCodeGenPending() && isJitModeFunction) || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
            {
                return true;
            }
            return false;
        });

        if (!isJitCandidate)
        {
            // Now check loop body entry points
            isJitCandidate = MapLoopHeadersUntil([=](uint loopNumber, LoopHeader* header)
            {
                return header->MapEntryPointsUntil([&](int index, LoopEntryPointInfo* entryPointInfo)
                {
                    if (entryPointInfo->IsCodeGenPending() || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
                    {
                        return true;
                    }
                    return false;
                });
            });
        }
#endif

        return !isJitCandidate;
    }